

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O2

void * compress_thread(void *pargs)

{
  uchar *puVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  char *__ptr;
  size_t sStack_100b0;
  uchar *puStack_100a8;
  int iStack_100a0;
  uchar *puStack_10090;
  int iStack_10088;
  undefined8 uStack_10068;
  undefined8 uStack_10060;
  undefined8 uStack_10058;
  uchar out [32768];
  uchar in [32768];
  
  uStack_10068 = 0;
  uStack_10060 = 0;
  uStack_10058 = 0;
  iVar2 = deflateInit_(&puStack_100a8,0xffffffffffffffff,"1.2.11",0x70);
  if (iVar2 == 0) {
    do {
      sVar3 = read_block(*pargs,in,0x8000);
      iStack_100a0 = (int)sVar3;
      puVar1 = in;
      if (sVar3 < 0) {
        __ptr = "error reading\n";
        goto LAB_00102ccb;
      }
      do {
        puStack_100a8 = puVar1;
        iStack_10088 = 0x8000;
        puStack_10090 = out;
        iVar2 = deflate(&puStack_100a8,0);
        if (iVar2 == -2) goto LAB_00102ca5;
        uVar5 = 0x8000 - iStack_10088;
        sVar4 = write_block(*(int *)((long)pargs + 4),out,(ulong)uVar5);
        if (sVar4 < (long)(ulong)uVar5) goto LAB_00102cba;
        puVar1 = puStack_100a8;
      } while (iStack_10088 == 0);
      if (iStack_100a0 != 0) goto LAB_00102ca5;
    } while (sVar3 != 0);
    iVar2 = deflate(&puStack_100a8,4);
    if (iVar2 == -2) {
LAB_00102ca5:
      __ptr = "zlib internal error\n";
      sStack_100b0 = 0x14;
    }
    else {
      uVar5 = 0x8000 - iStack_10088;
      sVar3 = write_block(*(int *)((long)pargs + 4),out,(ulong)uVar5);
      if ((long)(ulong)uVar5 <= sVar3) {
        deflateEnd(&puStack_100a8);
        goto LAB_00102cd6;
      }
LAB_00102cba:
      __ptr = "error writing\n";
LAB_00102ccb:
      sStack_100b0 = 0xe;
    }
  }
  else {
    __ptr = "error init zlib\n";
    sStack_100b0 = 0x10;
  }
  fwrite(__ptr,sStack_100b0,1,_stderr);
LAB_00102cd6:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *compress_thread(void *pargs) {
  args_t *args = (args_t *)pargs;

  int ret;
  unsigned have;
  z_stream strm;
  unsigned char in[PSVIMG_BLOCK_SIZE];
  unsigned char out[PSVIMG_BLOCK_SIZE];
  ssize_t rd;

  /* allocate deflate state */
  strm.zalloc = Z_NULL;
  strm.zfree = Z_NULL;
  strm.opaque = Z_NULL;
  ret = deflateInit(&strm, Z_DEFAULT_COMPRESSION);
  if (ret != Z_OK) {
    fprintf(stderr, "error init zlib\n");
    goto end;
  }

  /* compress until end of file */
  do {
    strm.avail_in = rd = read_block(args->in, in, sizeof(in));
    if (rd < 0) {
      fprintf(stderr, "error reading\n");
      goto end;
    }
    strm.next_in = in;

    /* run deflate() on input until output buffer not full, finish
       compression if all of source has been read in */
    do {
      strm.avail_out = PSVIMG_BLOCK_SIZE;
      strm.next_out = out;
      ret = deflate(&strm, Z_NO_FLUSH);    /* no bad return value */
      if (ret == Z_STREAM_ERROR) {  /* state not clobbered */
        fprintf(stderr, "zlib internal error\n");
        goto end;
      }
      have = PSVIMG_BLOCK_SIZE - strm.avail_out;
      if (write_block(args->out, out, have) < have) {
        fprintf(stderr, "error writing\n");
        goto end;
      }
    } while (strm.avail_out == 0);
    if (strm.avail_in != 0){     /* all input will be used */
      fprintf(stderr, "zlib internal error\n");
      goto end;
    }

    /* done when last data in file processed */
  } while (rd > 0);
  if (deflate(&strm, Z_FINISH) == Z_STREAM_ERROR) {  /* state not clobbered */
    fprintf(stderr, "zlib internal error\n");
    goto end;
  }
  have = PSVIMG_BLOCK_SIZE - strm.avail_out;
  if (write_block(args->out, out, have) < have) {
    fprintf(stderr, "error writing\n");
    goto end;
  }

  /* clean up and return */
  (void)deflateEnd(&strm);

end:
  close(args->out);
  close(args->in);
  return NULL;
}